

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O3

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseArray
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,Value *json,
          SField *inName,int depth,Value *error)

{
  atomic<int> *paVar1;
  ushort uVar2;
  char cVar3;
  char cVar4;
  UInt UVar5;
  UInt UVar6;
  Value *pVVar7;
  SField *inName_00;
  ostream *poVar8;
  Counter *pCVar9;
  optional<jbcoin::detail::STVar> *extraout_RAX;
  _Rb_tree_header *p_Var10;
  long *plVar11;
  ValueHolder VVar12;
  ValueHolder *pVVar13;
  undefined8 *puVar14;
  optional<jbcoin::detail::STVar> *poVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong *puVar17;
  size_type *psVar18;
  uint uVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong uVar22;
  string errMsg;
  string objectName;
  STArray tail;
  Value objectFields;
  stringstream ss;
  string local_328;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  long lStack_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  optional<jbcoin::detail::STVar> *local_2c8;
  string *local_2c0;
  string local_2b8;
  ulong *local_298;
  uint local_290;
  undefined4 uStack_28c;
  ulong local_288 [2];
  undefined1 local_278 [56];
  ValueHolder local_240;
  long local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  ValueHolder local_220;
  ushort local_218;
  undefined6 uStack_216;
  ValueHolder local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  ValueHolder local_1f8;
  ushort local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  Value local_1d8;
  ValueHolder local_1c8;
  ushort local_1c0;
  ValueHolder local_1b8;
  long local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  ValueHolder *local_168;
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  local_2c0 = json_name;
  if ((json->field_0x8 != '\0') && (json->field_0x8 != '\x06')) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   "Field \'",json_name);
    plVar11 = (long *)std::__cxx11::string::append((char *)local_278);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar16) {
      local_1a8._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_1a8._8_8_ = plVar11[3];
      local_1b8.string_ = (char *)&local_1a8;
    }
    else {
      local_1a8._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_1b8.string_ = (char *)*plVar11;
    }
    local_1b0 = plVar11[1];
    *plVar11 = (long)paVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    RPC::make_error((RPC *)&local_220.bool_,rpcINVALID_PARAMS,(string *)&local_1b8);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8.string_,local_1a8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    VVar12 = error->value_;
    pVVar13 = &local_220;
    error->value_ = local_220;
    uVar2 = *(ushort *)&error->field_0x8;
    *(ushort *)&error->field_0x8 = local_218 & 0x1ff | uVar2 & 0xfe00;
    local_218 = uVar2 & 0x1ff | local_218 & 0xfe00;
    local_220 = VVar12;
LAB_001b60e7:
    Json::Value::~Value((Value *)pVVar13);
    (__return_storage_ptr__->super_type).m_initialized = false;
    return extraout_RAX;
  }
  if (0x40 < depth) {
    pVVar13 = &local_1b8;
    too_deep((STParsedJSONDetail *)&pVVar13->bool_,json_name);
    VVar12 = error->value_;
    error->value_ = local_1b8;
    uVar2 = *(ushort *)&error->field_0x8;
    *(ushort *)&error->field_0x8 = (ushort)local_1b0 & 0x1ff | uVar2 & 0xfe00;
    local_1b0 = CONCAT62(local_1b0._2_6_,uVar2 & 0x1ff | (ushort)local_1b0 & 0xfe00);
    local_1b8 = VVar12;
    goto LAB_001b60e7;
  }
  local_2c8 = __return_storage_ptr__;
  STArray::STArray((STArray *)&local_220,inName);
  UVar5 = Json::Value::size(json);
  if (UVar5 != 0) {
    uVar22 = 0;
    do {
      UVar5 = (UInt)uVar22;
      pVVar7 = Json::Value::operator[](json,UVar5);
      uVar2 = *(ushort *)&pVVar7->field_0x8;
      cVar4 = (char)uVar2;
      if ((cVar4 != '\a') && (cVar4 != '\0')) {
LAB_001b60f5:
        std::operator+(&local_2e8,"Field \'",local_2c0);
        poVar15 = local_2c8;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar17 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_328.field_2._M_allocated_capacity = *puVar17;
          local_328.field_2._8_8_ = plVar11[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar17;
          local_328._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_328._M_string_length = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        cVar4 = '\x01';
        if (uVar22 < 10) goto LAB_001b65b1;
        cVar3 = '\x04';
        goto LAB_001b6309;
      }
      pVVar7 = Json::Value::operator[](json,UVar5);
      UVar6 = Json::Value::size(pVVar7);
      if (!(bool)(~(cVar4 != '\0' && (uVar2 & 0xff) != 7) & UVar6 == 1)) goto LAB_001b60f5;
      pVVar7 = Json::Value::operator[](json,UVar5);
      Json::Value::getMemberNames_abi_cxx11_((Members *)&local_1b8,pVVar7);
      poVar15 = local_2c8;
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,*(size_type *)local_1b8.string_,
                 *(size_type *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_1b8.map_)->_M_t)->_M_local_buf + 8) + *(size_type *)local_1b8.string_
                );
      beast::unit_test::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b8);
      inName_00 = SField::getField(&local_2b8);
      if (inName_00->fieldCode == sfInvalid) {
        unknown_field((string *)&local_1b8,(string *)(local_2c0->_M_dataplus)._M_p);
        VVar12 = error->value_;
        (error->value_).map_ = (ObjectValues *)local_1b8;
        uVar2 = *(ushort *)&error->field_0x8;
        *(ushort *)&error->field_0x8 = (ushort)local_1b0 & 0x1ff | uVar2 & 0xfe00;
        local_1b0 = CONCAT62(local_1b0._2_6_,uVar2 & 0x1ff | (ushort)local_1b0 & 0xfe00);
        local_1b8 = VVar12;
        Json::Value::~Value((Value *)&local_1b8);
        (poVar15->super_type).m_initialized = false;
        goto LAB_001b6a83;
      }
      pVVar7 = Json::Value::operator[](json,UVar5);
      pVVar7 = Json::Value::operator[](pVVar7,local_2b8._M_dataplus._M_p);
      Json::Value::Value(&local_1d8,pVVar7);
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.bool_);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,(local_2c0->_M_dataplus)._M_p,
                          local_2c0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"].",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
      std::__cxx11::stringbuf::str();
      parseObject((optional<jbcoin::STObject> *)local_278,&local_328,&local_1d8,inName_00,depth + 1,
                  error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (local_278[0] == false) {
        pVVar7 = Json::Value::resolveReference(error,"error_message",false);
        Json::Value::asString_abi_cxx11_(&local_328,pVVar7);
        std::__cxx11::stringbuf::str();
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x27f6ab);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar16) {
          local_230._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_230._8_8_ = plVar11[3];
          local_240.string_ = (char *)&local_230;
        }
        else {
          local_230._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_240.string_ = (char *)*plVar11;
        }
        local_238 = plVar11[1];
        *plVar11 = (long)paVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_240.int_);
        puVar17 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar17) {
          local_2f8 = *puVar17;
          lStack_2f0 = plVar11[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *puVar17;
          local_308 = (ulong *)*plVar11;
        }
        local_300 = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_308,(ulong)local_328._M_dataplus._M_p);
        psVar18 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_2e8.field_2._M_allocated_capacity = *psVar18;
          local_2e8.field_2._8_8_ = puVar14[3];
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar18;
          local_2e8._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_2e8._M_string_length = puVar14[1];
        *puVar14 = psVar18;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        local_1f0 = 0x104;
        Json::valueAllocator();
        VVar12._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                                 (Json::valueAllocator::valueAllocator,local_2e8._M_dataplus._M_p,
                                  local_2e8._M_string_length & 0xffffffff);
        VVar12._4_4_ = extraout_var;
        local_1f8 = VVar12;
        pVVar13 = &Json::Value::resolveReference(error,"error_message",false)->value_;
        local_1f8 = *pVVar13;
        *pVVar13 = VVar12;
        local_1f0 = *(ushort *)(pVVar13 + 1);
        *(ushort *)(pVVar13 + 1) = local_1f0 & 0xfe00 | 0x104;
        local_1f0 = local_1f0 & 0x1ff;
        Json::Value::~Value((Value *)&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240.string_,local_230._M_allocated_capacity + 1);
        }
        poVar15 = local_2c8;
        if (local_298 != local_288) {
          operator_delete(local_298,local_288[0] + 1);
        }
        (poVar15->super_type).m_initialized = false;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001b6a3e;
      }
      if (*(int *)(local_278._16_8_ + 4) != 0xe) {
        std::__cxx11::stringbuf::str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_240,"Item \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1f8);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_240.int_);
        puVar17 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar17) {
          local_2f8 = *puVar17;
          lStack_2f0 = plVar11[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *puVar17;
          local_308 = (ulong *)*plVar11;
        }
        local_300 = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        cVar4 = '\x01';
        if (uVar22 < 10) goto LAB_001b67f1;
        cVar3 = '\x04';
        goto LAB_001b656a;
      }
      std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::
      emplace_back<jbcoin::STObject>
                ((vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)&local_210,
                 (STObject *)(local_278 + 8));
      if (local_278[0] == true) {
        STObject::~STObject((STObject *)(local_278 + 8));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.bool_);
      std::ios_base::~ios_base(local_138);
      Json::Value::~Value(&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      uVar22 = uVar22 + 1;
      UVar5 = Json::Value::size(json);
    } while (uVar22 < UVar5);
  }
  local_168 = (ValueHolder *)0x0;
  local_1b0 = CONCAT62(uStack_216,local_218);
  local_1b8.real_ = (double)&PTR__STBase_002d3040;
  pCVar9 = CountedObject<jbcoin::STArray>::getCounter();
  poVar15 = local_2c8;
  LOCK();
  paVar1 = &(pCVar9->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_1b8.real_ = (double)&PTR__STArray_002d2f58;
  local_1a8._M_allocated_capacity = (size_type)local_210;
  local_1a8._8_8_ = uStack_208;
  local_198 = local_200;
  local_210.real_ = 0.0;
  uStack_208 = 0;
  local_200 = 0;
  (local_2c8->super_type).m_initialized = false;
  *(undefined8 *)((long)&(local_2c8->super_type).m_storage.dummy_ + 0x50) = 0;
  *(undefined ***)&(local_2c8->super_type).m_storage.dummy_ = &PTR__STBase_002d3040;
  *(long *)((long)&(local_2c8->super_type).m_storage.dummy_ + 8) = local_1b0;
  local_168 = &local_1b8;
  pCVar9 = CountedObject<jbcoin::STArray>::getCounter();
  LOCK();
  paVar1 = &(pCVar9->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  *(undefined ***)&(poVar15->super_type).m_storage.dummy_ = &PTR__STArray_002d2f58;
  *(size_type *)((long)&(poVar15->super_type).m_storage.dummy_ + 0x10) =
       local_1a8._M_allocated_capacity;
  *(undefined8 *)((long)&(poVar15->super_type).m_storage.dummy_ + 0x18) = local_1a8._8_8_;
  *(undefined8 *)((long)&(poVar15->super_type).m_storage.dummy_ + 0x20) = local_198;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._8_8_ = 0;
  local_198 = 0;
  *(storage_type **)((long)&(poVar15->super_type).m_storage.dummy_ + 0x50) =
       &(poVar15->super_type).m_storage;
  (poVar15->super_type).m_initialized = true;
  if (local_168 == &local_1b8) {
    p_Var10 = (_Rb_tree_header *)local_168->string_;
  }
  else {
    if (local_168 == (ValueHolder *)0x0) goto LAB_001b6aa8;
    p_Var10 = &(local_168->map_->_M_t)._M_impl.super__Rb_tree_header;
  }
  (**(code **)&p_Var10->_M_header)();
  goto LAB_001b6aa8;
  while( true ) {
    if (uVar19 < 10000) goto LAB_001b65b1;
    uVar22 = (uVar22 & 0xffffffff) / 10000;
    cVar3 = cVar4 + '\x04';
    if (uVar19 < 100000) break;
LAB_001b6309:
    cVar4 = cVar3;
    uVar19 = (uint)uVar22;
    if (uVar19 < 100) {
      cVar4 = cVar4 + -2;
      goto LAB_001b65b1;
    }
    if (uVar19 < 1000) {
      cVar4 = cVar4 + -1;
      goto LAB_001b65b1;
    }
  }
  cVar4 = cVar4 + '\x01';
LAB_001b65b1:
  local_308 = &local_2f8;
  std::__cxx11::string::_M_construct((ulong)&local_308,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,(uint)local_300,UVar5);
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    uVar20 = local_328.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < local_300 + local_328._M_string_length) {
    uVar22 = 0xf;
    if (local_308 != &local_2f8) {
      uVar22 = local_2f8;
    }
    if (uVar22 < local_300 + local_328._M_string_length) goto LAB_001b6626;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_308,0,(char *)0x0,(ulong)local_328._M_dataplus._M_p);
  }
  else {
LAB_001b6626:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_308);
  }
  local_278._0_8_ = local_278 + 0x10;
  psVar18 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar18) {
    local_278._16_8_ = *psVar18;
    local_278._24_8_ = puVar14[3];
  }
  else {
    local_278._16_8_ = *psVar18;
    local_278._0_8_ = (size_type *)*puVar14;
  }
  local_278._8_8_ = *(type *)(puVar14 + 1);
  *puVar14 = psVar18;
  puVar14[1] = 0;
  *(undefined1 *)psVar18 = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_278);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 == paVar16) {
    local_1a8._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_1a8._8_8_ = puVar14[3];
    local_1b8.string_ = (char *)&local_1a8;
  }
  else {
    local_1a8._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_1b8.string_ = (char *)*puVar14;
  }
  local_1b0 = puVar14[1];
  *puVar14 = paVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  RPC::make_error((RPC *)&local_240.bool_,rpcINVALID_PARAMS,(string *)&local_1b8);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8.string_,local_1a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  VVar12 = error->value_;
  error->value_ = local_240;
  uVar2 = *(ushort *)&error->field_0x8;
  *(ushort *)&error->field_0x8 = (ushort)local_238 & 0x1ff | uVar2 & 0xfe00;
  local_238 = CONCAT62(local_238._2_6_,uVar2 & 0x1ff | (ushort)local_238 & 0xfe00);
  local_240 = VVar12;
  Json::Value::~Value((Value *)&local_240);
  (poVar15->super_type).m_initialized = false;
  goto LAB_001b6aa8;
  while( true ) {
    if (uVar19 < 10000) goto LAB_001b67f1;
    uVar22 = (uVar22 & 0xffffffff) / 10000;
    cVar3 = cVar4 + '\x04';
    if (uVar19 < 100000) break;
LAB_001b656a:
    cVar4 = cVar3;
    uVar19 = (uint)uVar22;
    if (uVar19 < 100) {
      cVar4 = cVar4 + -2;
      goto LAB_001b67f1;
    }
    if (uVar19 < 1000) {
      cVar4 = cVar4 + -1;
      goto LAB_001b67f1;
    }
  }
  cVar4 = cVar4 + '\x01';
LAB_001b67f1:
  local_298 = local_288;
  std::__cxx11::string::_M_construct((ulong)&local_298,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_298,local_290,UVar5);
  uVar22 = CONCAT44(uStack_28c,local_290) + local_300;
  uVar21 = 0xf;
  if (local_308 != &local_2f8) {
    uVar21 = local_2f8;
  }
  if (uVar21 < uVar22) {
    uVar21 = 0xf;
    if (local_298 != local_288) {
      uVar21 = local_288[0];
    }
    if (uVar21 < uVar22) goto LAB_001b6873;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_308);
  }
  else {
LAB_001b6873:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_298);
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  psVar18 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_2e8.field_2._M_allocated_capacity = *psVar18;
    local_2e8.field_2._8_8_ = puVar14[3];
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *psVar18;
    local_2e8._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_2e8._M_string_length = puVar14[1];
  *puVar14 = psVar18;
  puVar14[1] = 0;
  *(undefined1 *)psVar18 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  puVar17 = (ulong *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_328.field_2._M_allocated_capacity = *puVar17;
    local_328.field_2._8_8_ = plVar11[3];
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  }
  else {
    local_328.field_2._M_allocated_capacity = *puVar17;
    local_328._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_328._M_string_length = plVar11[1];
  *plVar11 = (long)puVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  RPC::make_error((RPC *)&local_1c8.bool_,rpcINVALID_PARAMS,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  poVar15 = local_2c8;
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240.string_,local_230._M_allocated_capacity + 1);
  }
  VVar12 = error->value_;
  error->value_ = local_1c8;
  uVar2 = *(ushort *)&error->field_0x8;
  *(ushort *)&error->field_0x8 = local_1c0 & 0x1ff | uVar2 & 0xfe00;
  local_1c0 = uVar2 & 0x1ff | local_1c0 & 0xfe00;
  local_1c8 = VVar12;
  Json::Value::~Value((Value *)&local_1c8);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
  }
  (poVar15->super_type).m_initialized = false;
LAB_001b6a3e:
  if (local_278[0] == true) {
    STObject::~STObject((STObject *)(local_278 + 8));
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.bool_);
  std::ios_base::~ios_base(local_138);
  Json::Value::~Value(&local_1d8);
LAB_001b6a83:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
LAB_001b6aa8:
  std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::~vector
            ((vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)&local_210);
  poVar15 = (optional<jbcoin::detail::STVar> *)CountedObject<jbcoin::STArray>::getCounter();
  LOCK();
  paVar1 = (atomic<int> *)&(poVar15->super_type).field_0x8;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  return poVar15;
}

Assistant:

static boost::optional <detail::STVar> parseArray (
    std::string const& json_name,
    Json::Value const& json,
    SField const& inName,
    int depth,
    Json::Value& error)
{
    if (! json.isArray ())
    {
        error = not_an_array (json_name);
        return boost::none;
    }

    if (depth > maxDepth)
    {
        error = too_deep (json_name);
        return boost::none;
    }

    try
    {
        STArray tail (inName);

        for (Json::UInt i = 0; json.isValidIndex (i); ++i)
        {
            bool const isObject (json[i].isObject());
            bool const singleKey (isObject ? json[i].size() == 1 : true);

            if (!isObject || !singleKey)
            {
                error = singleton_expected (json_name, i);
                return boost::none;
            }

            // TODO: There doesn't seem to be a nice way to get just the
            // first/only key in an object without copying all keys into
            // a vector
            std::string const objectName (json[i].getMemberNames()[0]);;
            auto const&       nameField (SField::getField(objectName));

            if (nameField == sfInvalid)
            {
                error = unknown_field (json_name, objectName);
                return boost::none;
            }

            Json::Value const objectFields (json[i][objectName]);

            std::stringstream ss;
            ss << json_name << "." <<
                "[" << i << "]." << objectName;

            auto ret = parseObject (ss.str (), objectFields,
                nameField, depth + 1, error);
            if (! ret)
            {
                    std::string errMsg = error["error_message"].asString ();
                    error["error_message"] = "Error at '" + ss.str () +
                        "'. " + errMsg;
                    return boost::none;
            }

            if (ret->getFName().fieldType != STI_OBJECT)
            {
                error = non_object_in_array (ss.str(), i);
                return boost::none;
            }

            tail.push_back (std::move (*ret));
        }

        return detail::make_stvar <STArray> (std::move (tail));
    }
    catch (std::exception const&)
    {
        error = invalid_data (json_name);
        return boost::none;
    }
}